

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O2

int __thiscall chrono::ChLinkMask::GetMaskDoc(ChLinkMask *this)

{
  ChConstraintTwoBodies *pCVar1;
  int iVar2;
  int j;
  int i;
  
  iVar2 = 0;
  for (i = 0; i < this->nconstr; i = i + 1) {
    pCVar1 = Constr_N(this,i);
    iVar2 = iVar2 + (uint)(pCVar1->super_ChConstraintTwo).super_ChConstraint.active;
  }
  return iVar2;
}

Assistant:

int ChLinkMask::GetMaskDoc() {
    int tot = 0;
    for (int j = 0; j < nconstr; j++) {
        if (Constr_N(j).IsActive())
            tot++;
    }
    return tot;
}